

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con,int i)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  Var VVar2;
  int iVar3;
  ConType *this_00;
  FunctionalConstraint *in_RSI;
  long in_RDI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> ccnew;
  LinTerms lt;
  Var resvar;
  QuadraticFunctionalConstraint fc;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  QuadraticExpr *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  QuadAndLinTerms *in_stack_fffffffffffff748;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff750;
  int var;
  undefined8 in_stack_fffffffffffff758;
  undefined1 fSort;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_01;
  QuadraticFunctionalConstraint *in_stack_fffffffffffff760;
  Context ctx;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff768;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *this_02;
  AlgConRhs<0> rr;
  undefined4 in_stack_fffffffffffff778;
  undefined1 *puVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff7a0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff7a8;
  LinTerms *in_stack_fffffffffffff7b0;
  Arguments *in_stack_fffffffffffff7d8;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
  *in_stack_fffffffffffff7e0;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff830;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
  *in_stack_fffffffffffff880;
  int in_stack_fffffffffffff88c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff890;
  undefined1 local_740 [212];
  Var local_66c;
  _Bit_pointer local_668;
  _Bit_type *local_660;
  undefined1 local_639 [169];
  Var local_590;
  undefined1 local_3c8 [952];
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  MakeAutoLinker<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
            (in_stack_fffffffffffff768,
             (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
              *)in_stack_fffffffffffff760,(int)((ulong)in_stack_fffffffffffff758 >> 0x20));
  fSort = (undefined1)((ulong)in_stack_fffffffffffff758 >> 0x38);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
  GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *)0x26d1eb);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetArguments
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)0x26d1fc);
  QuadAndLinTerms::QuadAndLinTerms
            (&in_stack_fffffffffffff750->super_QuadAndLinTerms,in_stack_fffffffffffff748);
  puVar4 = local_3c8;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             (double)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  MakeFunctionalConstraint(in_stack_fffffffffffff738);
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x26d24c);
  QuadAndLinTerms::~QuadAndLinTerms
            ((QuadAndLinTerms *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  VVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>
                    (in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  local_590 = VVar2;
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     (int)((ulong)in_stack_fffffffffffff738 >> 0x20));
  if (!bVar1) {
    FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
              ((FlatModel<mp::DefaultFlatModelParams> *)
               CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (int)((ulong)in_stack_fffffffffffff738 >> 0x20));
  }
  local_639._1_8_ = (pointer)0x3ff0000000000000;
  local_639._9_8_ = local_639 + 1;
  local_639._17_8_ = (pointer)0x1;
  rr.rhs_ = (double)local_639;
  std::allocator<double>::allocator((allocator<double> *)0x26d364);
  __l._M_array._4_4_ = VVar2;
  __l._M_array._0_4_ = in_stack_fffffffffffff778;
  __l._M_len = (size_type)puVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffff768);
  local_66c = local_590;
  local_668 = (_Bit_pointer)&local_66c;
  local_660 = (_Bit_type *)0x1;
  this_02 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)(local_740 + 0xd3);
  std::allocator<int>::allocator((allocator<int> *)0x26d3c4);
  __l_00._M_array._4_4_ = VVar2;
  __l_00._M_array._0_4_ = in_stack_fffffffffffff778;
  __l_00._M_len = (size_type)puVar4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,(allocator_type *)this_02);
  LinTerms::LinTerms(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff750);
  std::allocator<int>::~allocator((allocator<int> *)0x26d421);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff750);
  std::allocator<double>::~allocator((allocator<double> *)0x26d43b);
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     (LinTerms *)in_stack_fffffffffffff738);
  this_00 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
            ::GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                             *)0x26d45a);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(this_00);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (this_02,(LinTerms *)this_00,rr,(bool)fSort);
  ctx.value_ = (CtxVal)((ulong)this_00 >> 0x20);
  this_01 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)local_740;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
  ConditionalConstraint(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  var = (int)((ulong)(in_RDI + -0x208) >> 0x20);
  FunctionalConstraint::GetResultVar(local_10);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff88c,in_stack_fffffffffffff880);
  iVar3 = FunctionalConstraint::GetResultVar(local_10);
  FunctionalConstraint::GetContext(local_10);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr(this_01,var,ctx);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
  ~ConditionalConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
             0x26d544);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(iVar3,in_stack_fffffffffffff740));
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)CONCAT44(iVar3,in_stack_fffffffffffff740));
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_fffffffffffff830);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }